

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O2

void __thiscall Js::SharedContents::AddAgent(SharedContents *this,DWORD_PTR agent)

{
  HeapAllocator *alloc;
  SharableAgents *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  DWORD_PTR agent_local;
  AutoCriticalSection autoCS;
  
  agent_local = (DWORD_PTR)&this->csAgent;
  data._32_8_ = agent;
  CCLock::Enter((CCLock *)agent_local);
  this_00 = this->allowedAgents;
  if (this_00 == (SharableAgents *)0x0) {
    local_50 = (undefined1  [8])
               &JsUtil::
                List<unsigned_long,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_8c1ccee;
    data.filename._0_4_ = 0xf;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
    this_00 = (SharableAgents *)new<Memory::HeapAllocator>(0x30,alloc,0x2f6726);
    (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).alloc =
         &Memory::HeapAllocator::Instance;
    (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_013cc0d0;
    (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer =
         (Type)0x0;
    (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count = 0;
    this_00->length = 0;
    this_00->increment = 4;
    this->allowedAgents = this_00;
  }
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Add(this_00,(unsigned_long *)&data.line);
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&agent_local);
  return;
}

Assistant:

void SharedContents::AddAgent(DWORD_PTR agent)
    {
        AutoCriticalSection autoCS(&csAgent);
        if (allowedAgents == nullptr)
        {
            allowedAgents = HeapNew(SharableAgents, &HeapAllocator::Instance);
        }

        allowedAgents->Add(agent);
    }